

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceName
          (VClient *this,uint i_DeviceIndex,string *o_rDeviceName,Enum *o_rDeviceType)

{
  pointer pVVar1;
  ulong uVar2;
  bool bVar3;
  Enum EVar4;
  Enum GetResult;
  scoped_lock Lock;
  string local_50;
  
  uVar2 = (ulong)i_DeviceIndex;
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  GetResult = Success;
  bVar3 = InitGet<std::__cxx11::string,ViconDataStreamSDK::Core::DeviceType::Enum>
                    (this,&GetResult,o_rDeviceName,o_rDeviceType);
  EVar4 = GetResult;
  if (bVar3) {
    pVVar1 = (this->m_LatestFrame).m_Devices.
             super__Vector_base<ViconCGStream::VDeviceInfo,_std::allocator<ViconCGStream::VDeviceInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar2 < (ulong)(((long)(this->m_LatestFrame).m_Devices.
                               super__Vector_base<ViconCGStream::VDeviceInfo,_std::allocator<ViconCGStream::VDeviceInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x38)) {
      ClientUtils::AdaptDeviceName(&local_50,&pVVar1[uVar2].m_Name,pVVar1[uVar2].m_DeviceID);
      std::__cxx11::string::operator=((string *)o_rDeviceName,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = IsForcePlateDevice(this,pVVar1[uVar2].m_DeviceID);
      if (bVar3) {
        *o_rDeviceType = ForcePlate;
      }
      else {
        bVar3 = IsEyeTrackerDevice(this,pVVar1[uVar2].m_DeviceID);
        if (bVar3) {
          *o_rDeviceType = EyeTracker;
        }
        else {
          *o_rDeviceType = Unknown;
        }
      }
      EVar4 = Success;
    }
    else {
      EVar4 = InvalidIndex;
    }
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar4;
}

Assistant:

Result::Enum VClient::GetDeviceName( const unsigned int       i_DeviceIndex,
                                           std::string      & o_rDeviceName,
                                           DeviceType::Enum & o_rDeviceType ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceName, o_rDeviceType ) )
  {
    return GetResult; 
  }

  if( i_DeviceIndex >= m_LatestFrame.m_Devices.size() )
  {
    return Result::InvalidIndex;
  }

  const ViconCGStream::VDeviceInfo & rDevice( m_LatestFrame.m_Devices[ i_DeviceIndex ] );
  o_rDeviceName = AdaptDeviceName( rDevice.m_Name, rDevice.m_DeviceID );
  if( IsForcePlateDevice( rDevice.m_DeviceID ) )
  {
    o_rDeviceType = DeviceType::ForcePlate;
  }
  else if( IsEyeTrackerDevice( rDevice.m_DeviceID ) )
  {
    o_rDeviceType = DeviceType::EyeTracker;
  }
  else
  {
    o_rDeviceType = DeviceType::Unknown;
  }

  return Result::Success;
}